

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_which_secret.cpp
# Opt level: O3

void duckdb::DuckDBWhichSecretFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  FunctionData *pFVar2;
  pointer pcVar3;
  CatalogTransaction transaction_00;
  SecretManager *path_00;
  const_reference pvVar4;
  type pSVar5;
  pointer pBVar6;
  char *pcVar7;
  vector<duckdb::Value,_true> *this;
  string type;
  string path;
  CatalogTransaction transaction;
  allocator local_141;
  undefined1 local_140 [80];
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  undefined1 local_50 [24];
  _Alloc_hider _Stack_38;
  transaction_t local_30;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (*(char *)&pGVar1[1]._vptr_GlobalTableFunctionState == '\0') {
    optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
    pFVar2 = (data_p->bind_data).ptr;
    path_00 = SecretManager::Get(context);
    CatalogTransaction::GetSystemCatalogTransaction((CatalogTransaction *)local_50,context);
    this = (vector<duckdb::Value,_true> *)(pFVar2 + 4);
    pvVar4 = vector<duckdb::Value,_true>::operator[](this,0);
    Value::ToString_abi_cxx11_(&local_70,pvVar4);
    pvVar4 = vector<duckdb::Value,_true>::operator[](this,1);
    Value::ToString_abi_cxx11_((string *)local_90,pvVar4);
    transaction_00.context.ptr = (ClientContext *)local_50._8_8_;
    transaction_00.db.ptr = (DatabaseInstance *)local_50._0_8_;
    transaction_00.transaction.ptr = (Transaction *)local_50._16_8_;
    transaction_00.transaction_id = (transaction_t)_Stack_38._M_p;
    transaction_00.start_time = local_30;
    SecretManager::LookupSecret
              ((SecretManager *)local_140,transaction_00,(string *)path_00,&local_70);
    if ((_Head_base<0UL,_duckdb::SecretEntry_*,_false>)local_140._0_8_ ==
        (_Head_base<0UL,_duckdb::SecretEntry_*,_false>)0x0) {
      *(undefined1 *)&pGVar1[1]._vptr_GlobalTableFunctionState = 1;
    }
    else {
      pSVar5 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
               operator*((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>
                          *)local_140);
      output->count = 1;
      pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(&pSVar5->secret);
      pcVar3 = (pBVar6->name)._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (pBVar6->name)._M_string_length);
      Value::Value((Value *)(local_140 + 0x10),&local_d0);
      DataChunk::SetValue(output,0,0,(Value *)(local_140 + 0x10));
      Value::~Value((Value *)(local_140 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      pcVar7 = EnumUtil::ToChars<duckdb::SecretPersistType>(pSVar5->persist_type);
      ::std::__cxx11::string::string((string *)&local_b0,pcVar7,&local_141);
      Value::Value((Value *)(local_140 + 0x10),&local_b0);
      DataChunk::SetValue(output,1,0,(Value *)(local_140 + 0x10));
      Value::~Value((Value *)(local_140 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      pcVar3 = (pSVar5->storage_mode)._M_dataplus._M_p;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar3,pcVar3 + (pSVar5->storage_mode)._M_string_length);
      Value::Value((Value *)(local_140 + 0x10),&local_f0);
      DataChunk::SetValue(output,2,0,(Value *)(local_140 + 0x10));
      Value::~Value((Value *)(local_140 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      *(undefined1 *)&pGVar1[1]._vptr_GlobalTableFunctionState = 1;
      if ((SecretEntry *)local_140._0_8_ != (SecretEntry *)0x0) {
        ::std::default_delete<duckdb::SecretEntry>::operator()
                  ((default_delete<duckdb::SecretEntry> *)local_140,(SecretEntry *)local_140._0_8_);
      }
    }
    if ((_Hash_node_base *)local_90._0_8_ != (_Hash_node_base *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DuckDBWhichSecretFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBWhichSecretData>();
	if (data.finished) {
		// finished returning values
		return;
	}
	auto &bind_data = data_p.bind_data->Cast<DuckDBWhichSecretBindData>();

	auto &secret_manager = SecretManager::Get(context);
	auto transaction = CatalogTransaction::GetSystemCatalogTransaction(context);

	auto &inputs = bind_data.inputs;
	auto path = inputs[0].ToString();
	auto type = inputs[1].ToString();
	auto secret_match = secret_manager.LookupSecret(transaction, path, type);
	if (secret_match.HasMatch()) {
		auto &secret_entry = *secret_match.secret_entry;
		output.SetCardinality(1);
		output.SetValue(0, 0, secret_entry.secret->GetName());
		output.SetValue(1, 0, EnumUtil::ToString(secret_entry.persist_type));
		output.SetValue(2, 0, secret_entry.storage_mode);
	}
	data.finished = true;
}